

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O3

void __thiscall QIODevicePrivate::~QIODevicePrivate(QIODevicePrivate *this)

{
  Data *pDVar1;
  long lVar2;
  ulong uVar3;
  QArrayDataPointer<QRingChunk> *pQVar4;
  
  this->_vptr_QIODevicePrivate = (_func_int **)&PTR__QIODevicePrivate_001dc0c0;
  pDVar1 = (this->errorString).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->errorString).d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar2 = (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  pQVar4 = (QArrayDataPointer<QRingChunk> *)
           (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
  if (0 < lVar2) {
    uVar3 = lVar2 + 1;
    do {
      QArrayDataPointer<QRingChunk>::~QArrayDataPointer(pQVar4);
      pQVar4 = (QArrayDataPointer<QRingChunk> *)&pQVar4[1].size;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    pQVar4 = (QArrayDataPointer<QRingChunk> *)
             (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
  }
  if ((QVarLengthArray<QRingBuffer,_1LL> *)pQVar4 != &this->writeBuffers) {
    QtPrivate::sizedFree
              (pQVar4,(this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.a * 0x28);
  }
  lVar2 = (this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  pQVar4 = (QArrayDataPointer<QRingChunk> *)
           (this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
  if (0 < lVar2) {
    uVar3 = lVar2 + 1;
    do {
      QArrayDataPointer<QRingChunk>::~QArrayDataPointer(pQVar4);
      pQVar4 = (QArrayDataPointer<QRingChunk> *)&pQVar4[1].size;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    pQVar4 = (QArrayDataPointer<QRingChunk> *)
             (this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
  }
  if ((QVarLengthArray<QRingBuffer,_2LL> *)pQVar4 != &this->readBuffers) {
    QtPrivate::sizedFree
              (pQVar4,(this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.a * 0x28);
    return;
  }
  return;
}

Assistant:

QIODevicePrivate::~QIODevicePrivate()
{
}